

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.h
# Opt level: O0

void __thiscall HighsCliqueTable::HighsCliqueTable(HighsCliqueTable *this,HighsInt ncols)

{
  long in_RDI;
  HighsRandom *this_00;
  size_type __new_size;
  vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *this_01;
  size_type __new_size_00;
  vector<int,_std::allocator<int>_> *this_02;
  HighsUInt seed;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
  *in_stack_ffffffffffffff60;
  
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             0x55c883);
  std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::vector
            ((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)0x55c899)
  ;
  std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::vector
            ((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *)
             0x55c8af);
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
  HighsHashTable(in_stack_ffffffffffffff60);
  seed = (HighsUInt)((ulong)(in_RDI + 0x70) >> 0x20);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)0x55c8dc);
  this_00 = (HighsRandom *)(in_RDI + 0xa0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x55c8f2);
  std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::vector
            ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)0x55c908
            );
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x55c91e);
  __new_size = in_RDI + 0xe8;
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             0x55c934);
  this_01 = (vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
            (in_RDI + 0x100);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x55c94a);
  __new_size_00 = in_RDI + 0x118;
  std::vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>::
  vector((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_> *)
         0x55c960);
  this_02 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x130);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x55c976);
  std::
  vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
  ::vector((vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
            *)0x55c98c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x55c9a2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x55c9b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x55c9ce);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x55c9e4);
  HighsRandom::HighsRandom(this_00,seed);
  std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::resize
            (this_01,__new_size);
  std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::resize
            ((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *)this_01
             ,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (this_02,__new_size_00,(value_type_conflict2 *)this_01);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_01,__new_size);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02,__new_size_00,
             (value_type_conflict5 *)this_01);
  *(undefined4 *)(in_RDI + 0x1c8) = 0;
  *(undefined8 *)(in_RDI + 0x1e0) = 0;
  *(undefined4 *)(in_RDI + 0x1cc) = 0;
  *(undefined4 *)(in_RDI + 0x1d0) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x1d4) = 0x7fffffff;
  *(undefined1 *)(in_RDI + 0x1d8) = 0;
  return;
}

Assistant:

HighsCliqueTable(HighsInt ncols) {
    invertedHashList.resize(2 * static_cast<size_t>(ncols));
    invertedHashListSizeTwo.resize(2 * static_cast<size_t>(ncols));
    numcliquesvar.resize(2 * static_cast<size_t>(ncols), 0);
    colsubstituted.resize(ncols);
    colDeleted.resize(ncols, false);
    nfixings = 0;
    numNeighbourhoodQueries = 0;
    numEntries = 0;
    maxEntries = kHighsIInf;
    minEntriesForParallelism = kHighsIInf;
    inPresolve = false;
  }